

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::string_t,duckdb::string_t,duckdb::GreaterThanEquals,false,true,true,true>
                (string_t *ldata,string_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  idx_t iVar9;
  sel_t sVar10;
  ulong uVar11;
  string_t *psVar12;
  long lVar13;
  
  if (count + 0x3f < 0x40) {
    iVar9 = 0;
  }
  else {
    iVar9 = 0;
    lVar13 = 0;
    uVar5 = 0;
    uVar11 = 0;
    do {
      puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar6 = 0xffffffffffffffff;
      }
      else {
        uVar6 = puVar1[uVar5];
      }
      uVar7 = uVar11 + 0x40;
      if (count <= uVar11 + 0x40) {
        uVar7 = count;
      }
      uVar8 = uVar11;
      if (uVar6 == 0xffffffffffffffff) {
        if (uVar11 < uVar7) {
          psVar12 = ldata + uVar11;
          do {
            uVar6 = uVar11;
            if (sel->sel_vector != (sel_t *)0x0) {
              uVar6 = (ulong)sel->sel_vector[uVar11];
            }
            bVar4 = string_t::StringComparisonOperators::GreaterThan(rdata,psVar12);
            true_sel->sel_vector[iVar9] = (sel_t)uVar6;
            iVar9 = iVar9 + !bVar4;
            false_sel->sel_vector[lVar13] = (sel_t)uVar6;
            lVar13 = lVar13 + (ulong)bVar4;
            uVar11 = uVar11 + 1;
            psVar12 = psVar12 + 1;
            uVar8 = uVar11;
          } while (uVar7 != uVar11);
        }
      }
      else if (uVar6 == 0) {
        uVar8 = uVar7;
        if (uVar11 < uVar7) {
          psVar2 = sel->sel_vector;
          psVar3 = false_sel->sel_vector;
          do {
            sVar10 = (sel_t)uVar11;
            if (psVar2 != (sel_t *)0x0) {
              sVar10 = psVar2[uVar11];
            }
            psVar3[lVar13] = sVar10;
            lVar13 = lVar13 + 1;
            uVar11 = uVar11 + 1;
          } while (uVar7 != uVar11);
        }
      }
      else if (uVar11 < uVar7) {
        psVar12 = ldata + uVar11;
        uVar8 = 0;
        do {
          if (sel->sel_vector == (sel_t *)0x0) {
            sVar10 = (int)uVar8 + (int)uVar11;
          }
          else {
            sVar10 = sel->sel_vector[uVar11 + uVar8];
          }
          if ((uVar6 >> (uVar8 & 0x3f) & 1) == 0) {
            bVar4 = false;
          }
          else {
            bVar4 = string_t::StringComparisonOperators::GreaterThan(rdata,psVar12);
            bVar4 = !bVar4;
          }
          true_sel->sel_vector[iVar9] = sVar10;
          iVar9 = iVar9 + bVar4;
          false_sel->sel_vector[lVar13] = sVar10;
          lVar13 = lVar13 + (ulong)(bVar4 ^ 1);
          uVar8 = uVar8 + 1;
          psVar12 = psVar12 + 1;
        } while ((uVar11 - uVar7) + uVar8 != 0);
        uVar8 = uVar11 + uVar8;
      }
      uVar5 = uVar5 + 1;
      uVar11 = uVar8;
    } while (uVar5 != count + 0x3f >> 6);
  }
  return iVar9;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}